

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O2

void __thiscall xmrig::CpuBackend::printHashrate(CpuBackend *this,bool details)

{
  pointer pCVar1;
  int64_t iVar2;
  double dVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar5;
  undefined4 extraout_var_01;
  char *pcVar6;
  undefined4 extraout_var_02;
  char *pcVar7;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined7 in_register_00000031;
  CpuLaunchData *data;
  pointer pCVar8;
  size_t threadId;
  char num [24];
  
  if ((int)CONCAT71(in_register_00000031,details) != 0) {
    iVar4 = (*(this->super_IBackend)._vptr_IBackend[4])();
    if (CONCAT44(extraout_var,iVar4) != 0) {
      num[0] = '\0';
      num[1] = '\0';
      num[2] = '\0';
      num[3] = '\0';
      num[4] = '\0';
      num[5] = '\0';
      num[6] = '\0';
      num[7] = '\0';
      num[8] = '\0';
      num[9] = '\0';
      num[10] = '\0';
      num[0xb] = '\0';
      num[0xc] = '\0';
      num[0xd] = '\0';
      num[0xe] = '\0';
      num[0xf] = '\0';
      num[0x10] = '\0';
      num[0x11] = '\0';
      num[0x12] = '\0';
      num[0x13] = '\0';
      num[0x14] = '\0';
      num[0x15] = '\0';
      num[0x16] = '\0';
      num[0x17] = '\0';
      Log::print("\x1b[1;37m|    CPU # | AFFINITY | 10s H/s | 60s H/s | 15m H/s |");
      pCVar1 = (this->d_ptr->threads).
               super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      threadId = 0;
      for (pCVar8 = (this->d_ptr->threads).
                    super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
                    _M_impl.super__Vector_impl_data._M_start; pCVar8 != pCVar1; pCVar8 = pCVar8 + 1)
      {
        iVar2 = pCVar8->affinity;
        iVar4 = (*(this->super_IBackend)._vptr_IBackend[4])(this);
        dVar3 = Hashrate::calc((Hashrate *)CONCAT44(extraout_var_00,iVar4),threadId,10000);
        pcVar5 = Hashrate::format(dVar3,num,8);
        iVar4 = (*(this->super_IBackend)._vptr_IBackend[4])(this);
        dVar3 = Hashrate::calc((Hashrate *)CONCAT44(extraout_var_01,iVar4),threadId,60000);
        pcVar6 = Hashrate::format(dVar3,num + 8,8);
        iVar4 = (*(this->super_IBackend)._vptr_IBackend[4])(this);
        dVar3 = Hashrate::calc((Hashrate *)CONCAT44(extraout_var_02,iVar4),threadId,900000);
        pcVar7 = Hashrate::format(dVar3,num + 0x10,8);
        Log::print("| %8zu | %8ld | %7s | %7s | %7s |",threadId,iVar2,pcVar5,pcVar6,pcVar7);
        threadId = threadId + 1;
      }
      iVar4 = (*(this->super_IBackend)._vptr_IBackend[4])(this);
      dVar3 = Hashrate::calc((Hashrate *)CONCAT44(extraout_var_03,iVar4),10000);
      pcVar5 = Hashrate::format(dVar3,num,8);
      iVar4 = (*(this->super_IBackend)._vptr_IBackend[4])(this);
      dVar3 = Hashrate::calc((Hashrate *)CONCAT44(extraout_var_04,iVar4),60000);
      pcVar6 = Hashrate::format(dVar3,num + 8,8);
      iVar4 = (*(this->super_IBackend)._vptr_IBackend[4])(this);
      dVar3 = Hashrate::calc((Hashrate *)CONCAT44(extraout_var_05,iVar4),900000);
      pcVar7 = Hashrate::format(dVar3,num + 0x10,8);
      Log::print("\x1b[1;37m|        - |        - | %7s | %7s | %7s |",pcVar5,pcVar6,pcVar7);
    }
  }
  return;
}

Assistant:

void xmrig::CpuBackend::printHashrate(bool details)
{
    if (!details || !hashrate()) {
        return;
    }

    char num[8 * 3] = { 0 };

    Log::print(WHITE_BOLD_S "|    CPU # | AFFINITY | 10s H/s | 60s H/s | 15m H/s |");

    size_t i = 0;
    for (const CpuLaunchData &data : d_ptr->threads) {
         Log::print("| %8zu | %8" PRId64 " | %7s | %7s | %7s |",
                    i,
                    data.affinity,
                    Hashrate::format(hashrate()->calc(i, Hashrate::ShortInterval),  num,         sizeof num / 3),
                    Hashrate::format(hashrate()->calc(i, Hashrate::MediumInterval), num + 8,     sizeof num / 3),
                    Hashrate::format(hashrate()->calc(i, Hashrate::LargeInterval),  num + 8 * 2, sizeof num / 3)
                    );

         i++;
    }

#   ifdef XMRIG_FEATURE_OPENCL
    Log::print(WHITE_BOLD_S "|        - |        - | %7s | %7s | %7s |",
               Hashrate::format(hashrate()->calc(Hashrate::ShortInterval),  num,         sizeof num / 3),
               Hashrate::format(hashrate()->calc(Hashrate::MediumInterval), num + 8,     sizeof num / 3),
               Hashrate::format(hashrate()->calc(Hashrate::LargeInterval),  num + 8 * 2, sizeof num / 3)
               );
#   endif
}